

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

OPJ_BOOL opj_setup_encoder(opj_codec_t *p_codec,opj_cparameters_t *parameters,opj_image_t *p_image)

{
  opj_codec_private_t *l_codec;
  opj_image_t *p_image_local;
  opj_cparameters_t *parameters_local;
  opj_codec_t *p_codec_local;
  
  if ((((p_codec == (opj_codec_t *)0x0) || (parameters == (opj_cparameters_t *)0x0)) ||
      (p_image == (opj_image_t *)0x0)) || (*(int *)(p_codec + 0x12) != 0)) {
    p_codec_local._4_4_ = 0;
  }
  else {
    p_codec_local._4_4_ = (*(code *)p_codec[5])(p_codec[0xb],parameters,p_image,p_codec + 0xc);
  }
  return p_codec_local._4_4_;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_setup_encoder(opj_codec_t *p_codec,
                                        opj_cparameters_t *parameters,
                                        opj_image_t *p_image)
{
    if (p_codec && parameters && p_image) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

        if (! l_codec->is_decompressor) {
            return l_codec->m_codec_data.m_compression.opj_setup_encoder(l_codec->m_codec,
                    parameters,
                    p_image,
                    &(l_codec->m_event_mgr));
        }
    }

    return OPJ_FALSE;
}